

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainCache.cpp
# Opt level: O3

bool parseParameters(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  
  pcVar3 = traceFilePath;
  if (1 < argc) {
    uVar4 = 1;
    pcVar2 = traceFilePath;
    do {
      pcVar3 = argv[uVar4];
      if (*pcVar3 == '-') {
        pcVar1 = traceFilePath;
        if (pcVar3[1] == 's') {
          isSingleStep = true;
          pcVar3 = pcVar2;
        }
        else {
          if (pcVar3[1] != 'v') {
            return false;
          }
          verbose = true;
          pcVar3 = pcVar2;
        }
      }
      else {
        pcVar1 = pcVar3;
        if (pcVar2 != (char *)0x0) {
          return false;
        }
      }
      traceFilePath = pcVar1;
      uVar4 = uVar4 + 1;
      pcVar2 = pcVar3;
    } while ((uint)argc != uVar4);
  }
  return pcVar3 != (char *)0x0;
}

Assistant:

bool parseParameters(int argc, char **argv) {
  // Read Parameters
  for (int i = 1; i < argc; ++i) {
    if (argv[i][0] == '-') {
      switch (argv[i][1]) {
      case 'v':
        verbose = 1;
        break;
      case 's':
        isSingleStep = 1;
        break;
      default:
        return false;
      }
    } else {
      if (traceFilePath == nullptr) {
        traceFilePath = argv[i];
      } else {
        return false;
      }
    }
  }
  if (traceFilePath == nullptr) {
    return false;
  }
  return true;
}